

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O0

int Fra_OneHotCount(Fra_Man_t *p,Vec_Int_t *vOneHots)

{
  int iVar1;
  int iVar2;
  int local_28;
  int Counter;
  int Out2;
  int Out1;
  int i;
  Vec_Int_t *vOneHots_local;
  Fra_Man_t *p_local;
  
  local_28 = 0;
  for (Out2 = 0; iVar1 = Vec_IntSize(vOneHots), Out2 < iVar1; Out2 = Out2 + 2) {
    iVar1 = Vec_IntEntry(vOneHots,Out2);
    iVar2 = Vec_IntEntry(vOneHots,Out2 + 1);
    if ((iVar1 != 0) || (iVar2 != 0)) {
      local_28 = local_28 + 1;
    }
  }
  return local_28;
}

Assistant:

int Fra_OneHotCount( Fra_Man_t * p, Vec_Int_t * vOneHots )
{
    int i, Out1, Out2, Counter = 0;
    for ( i = 0; i < Vec_IntSize(vOneHots); i += 2 )
    {
        Out1 = Vec_IntEntry( vOneHots, i );
        Out2 = Vec_IntEntry( vOneHots, i+1 );
        if ( Out1 == 0 && Out2 == 0 )
            continue;
        Counter++;
    }
    return Counter;
}